

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_length_byte_array_decoder.cpp
# Opt level: O1

void __thiscall
duckdb::DeltaLengthByteArrayDecoder::ReadInternal<true>
          (DeltaLengthByteArrayDecoder *this,shared_ptr<duckdb::ResizeableBuffer,_true> *block_ref,
          uint8_t *defines,idx_t read_count,Vector *result,idx_t result_offset)

{
  uint64_t *puVar1;
  ulong *puVar2;
  uint uVar3;
  ulong uVar4;
  data_ptr_t __src;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  type pRVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  StringColumnReader *this_01;
  IOException *this_02;
  data_ptr_t pdVar10;
  idx_t idx_in_entry;
  string local_88;
  uint8_t *local_68;
  type local_60;
  data_ptr_t local_58;
  data_ptr_t local_50;
  shared_ptr<duckdb::ResizeableBuffer,_true> *local_48;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  local_48 = block_ref;
  pRVar8 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*(block_ref);
  local_58 = (this->length_buffer->super_ByteBuffer).ptr;
  pdVar10 = result->data;
  FlatVector::VerifyFlatVector(result);
  local_50 = (pRVar8->super_ByteBuffer).ptr;
  if (read_count != 0) {
    local_40 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    pdVar10 = pdVar10 + result_offset * 0x10 + 4;
    local_68 = defines;
    local_60 = pRVar8;
    do {
      if (this->reader->column_schema->max_define == (ulong)defines[result_offset]) {
        uVar4 = this->length_idx;
        if (this->byte_array_count <= uVar4) {
          this_02 = (IOException *)__cxa_allocate_exception(0x10);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,
                     "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted read of %d from %d entries) - corrupt file?"
                     ,"");
          IOException::IOException<unsigned_long,unsigned_long>
                    (this_02,&local_88,this->length_idx,this->byte_array_count);
          __cxa_throw(this_02,&IOException::typeinfo,::std::runtime_error::~runtime_error);
        }
        this->length_idx = uVar4 + 1;
        __src = (pRVar8->super_ByteBuffer).ptr;
        uVar3 = *(uint *)(local_58 + uVar4 * 4);
        if ((ulong)uVar3 < 0xd) {
          local_88._M_string_length._0_4_ = 0;
          local_88._M_dataplus._M_p._0_4_ = 0;
          local_88._M_dataplus._M_p._4_4_ = 0;
          if (uVar3 != 0) {
            switchD_00b1422a::default(&local_88,__src,(ulong)uVar3);
            pRVar8 = local_60;
            defines = local_68;
          }
        }
        else {
          local_88._M_dataplus._M_p._0_4_ = *(undefined4 *)__src;
          local_88._M_dataplus._M_p._4_4_ = SUB84(__src,0);
          local_88._M_string_length._0_4_ = (undefined4)((ulong)__src >> 0x20);
        }
        *(uint *)(pdVar10 + -4) = uVar3;
        *(ulong *)pdVar10 =
             CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_);
        *(undefined4 *)(pdVar10 + 8) = (undefined4)local_88._M_string_length;
        uVar3 = *(uint *)(local_58 + uVar4 * 4);
        puVar1 = &(pRVar8->super_ByteBuffer).len;
        *puVar1 = *puVar1 - (ulong)uVar3;
        (pRVar8->super_ByteBuffer).ptr = (pRVar8->super_ByteBuffer).ptr + uVar3;
      }
      else {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_88,&local_38);
          peVar6 = (element_type *)
                   CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_);
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_88._M_string_length._4_4_,(undefined4)local_88._M_string_length);
          local_88._M_dataplus._M_p._0_4_ = 0;
          local_88._M_dataplus._M_p._4_4_ = 0;
          local_88._M_string_length._0_4_ = 0;
          local_88._M_string_length._4_4_ = 0;
          this_00 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar6;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_88._M_string_length._4_4_,(undefined4)local_88._M_string_length) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(local_88._M_string_length._4_4_,
                                (undefined4)local_88._M_string_length));
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          pRVar8 = local_60;
          defines = local_68;
        }
        bVar5 = (byte)result_offset & 0x3f;
        puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (result_offset >> 6);
        *puVar2 = *puVar2 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      result_offset = result_offset + 1;
      pdVar10 = pdVar10 + 0x10;
      read_count = read_count - 1;
    } while (read_count != 0);
  }
  this_01 = ColumnReader::Cast<duckdb::StringColumnReader>(this->reader);
  StringColumnReader::VerifyString
            (this_01,(char *)local_50,*(int *)&(pRVar8->super_ByteBuffer).ptr - (int)local_50);
  StringColumnReader::ReferenceBlock(result,local_48);
  return;
}

Assistant:

void DeltaLengthByteArrayDecoder::ReadInternal(shared_ptr<ResizeableBuffer> &block_ref, uint8_t *const defines,
                                               const idx_t read_count, Vector &result, const idx_t result_offset) {
	auto &block = *block_ref;
	const auto length_data = reinterpret_cast<uint32_t *>(length_buffer.ptr);
	auto result_data = FlatVector::GetData<string_t>(result);
	auto &result_mask = FlatVector::Validity(result);

	if (!HAS_DEFINES) {
		// Fast path: take this out of the loop below
		if (length_idx + read_count > byte_array_count) {
			throw IOException(
			    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
			    "read of %d from %d entries) - corrupt file?",
			    length_idx + read_count, byte_array_count);
		}
	}

	const auto start_ptr = block.ptr;
	for (idx_t row_idx = 0; row_idx < read_count; row_idx++) {
		const auto result_idx = result_offset + row_idx;
		if (HAS_DEFINES) {
			if (defines[result_idx] != reader.MaxDefine()) {
				result_mask.SetInvalid(result_idx);
				continue;
			}
			if (length_idx >= byte_array_count) {
				throw IOException(
				    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
				    "read of %d from %d entries) - corrupt file?",
				    length_idx, byte_array_count);
			}
		}
		const auto &str_len = length_data[length_idx++];
		result_data[result_idx] = string_t(char_ptr_cast(block.ptr), str_len);
		block.unsafe_inc(str_len);
	}

	// Verify that the strings we read are valid UTF-8
	reader.Cast<StringColumnReader>().VerifyString(char_ptr_cast(start_ptr), block.ptr - start_ptr);

	StringColumnReader::ReferenceBlock(result, block_ref);
}